

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

float trng::math::detail::inv_Beta_I<float>(float x,float p,float q,float norm)

{
  int in_EDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float extraout_XMM0_Da;
  double dVar3;
  double dVar4;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float dy;
  float df;
  float f;
  int i;
  float w;
  float u;
  float t;
  float lnq;
  float lnp;
  float y;
  float local_3c;
  int local_30;
  float in_stack_ffffffffffffffe4;
  float local_4;
  
  fVar1 = Catch::clara::std::numeric_limits<float>::epsilon();
  if (fVar1 <= in_XMM0_Da) {
    fVar1 = Catch::clara::std::numeric_limits<float>::epsilon();
    if (fVar1 <= 1.0 - in_XMM0_Da) {
      if ((in_XMM1_Da * 2.0 < 1.0) || (in_XMM2_Da * 2.0 < 1.0)) {
        in_stack_ffffffffffffffe4 = ln(0.0);
        fVar1 = ln(0.0);
        dVar3 = std::exp((double)(ulong)(uint)(in_XMM1_Da * in_stack_ffffffffffffffe4));
        fVar2 = SUB84(dVar3,0) / in_XMM1_Da;
        dVar3 = std::exp((double)(ulong)(uint)(in_XMM2_Da * fVar1));
        fVar1 = fVar2 + SUB84(dVar3,0) / in_XMM2_Da;
        if (fVar2 / fVar1 <= in_XMM0_Da) {
          dVar3 = std::pow((double)(ulong)(uint)(in_XMM2_Da * fVar1 * (1.0 - in_XMM0_Da)),
                           (double)(ulong)(uint)(1.0 / in_XMM2_Da));
          local_4 = 1.0 - SUB84(dVar3,0);
        }
        else {
          dVar3 = std::pow((double)(ulong)(uint)(in_XMM1_Da * fVar1 * in_XMM0_Da),
                           (double)(ulong)(uint)(1.0 / in_XMM1_Da));
          local_4 = SUB84(dVar3,0);
        }
      }
      else {
        local_4 = (in_XMM1_Da * 3.0 + -1.0) / ((in_XMM1_Da * 3.0 + in_XMM2_Da * 3.0) - 2.0);
      }
      for (local_30 = 0; local_30 < 0x18; local_30 = local_30 + 1) {
        fVar1 = Beta_I<float>(in_XMM2_Da,in_XMM3_Da,local_4,in_stack_ffffffffffffffe4);
        dVar3 = std::pow((double)(ulong)(uint)(1.0 - local_4),
                         (double)(ulong)(uint)(in_XMM2_Da - 1.0));
        dVar4 = std::pow((double)(ulong)(uint)local_4,(double)(ulong)(uint)(in_XMM1_Da - 1.0));
        local_3c = (fVar1 - in_XMM0_Da) / ((SUB84(dVar3,0) * SUB84(dVar4,0)) / in_XMM3_Da);
        Catch::clara::std::abs(in_EDI);
        fVar1 = Catch::clara::std::numeric_limits<float>::epsilon();
        if (extraout_XMM0_Da < fVar1 * 2.0) {
          return local_4;
        }
        for (; local_4 - local_3c <= 0.0 || 1.0 <= local_4 - local_3c; local_3c = local_3c * 0.75) {
        }
        local_4 = local_4 - local_3c;
      }
    }
    else {
      local_4 = 1.0;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

TRNG_CUDA_ENABLE T inv_Beta_I(T x, T p, T q, T norm) {
        if (x < numeric_limits<T>::epsilon())
          return 0;
        if (1 - x < numeric_limits<T>::epsilon())
          return 1;
        // solve via Newton method
        T y{0};
        if (2 * p >= 1 and 2 * q >= 1)
          y = (3 * p - 1) / (3 * p + 3 * q - 2);  // the approximate median
        else {
          // following initial guess given in "Numerical Recipes" by W. H. Press et al., 3rd
          // edition
          const T lnp{ln(p / (p + q))};
          const T lnq{ln(q / (p + q))};
          const T t{exp(p * lnp) / p};
          const T u{exp(q * lnq) / q};
          const T w{t + u};
          if (x < t / w)
            y = pow(p * w * x, 1 / p);
          else
            y = 1 - pow(q * w * (1 - x), 1 / q);
        }
        for (int i{0}; i < numeric_limits<T>::digits; ++i) {
          const T f{Beta_I(y, p, q, norm) - x};
          const T df{pow(1 - y, q - 1) * pow(y, p - 1) / norm};
          T dy(f / df);
          if (abs(f / y) < 2 * numeric_limits<T>::epsilon())
            break;
          // avoid overshooting
          while (y - dy <= 0 or y - dy >= 1)
            dy *= T{3} / T{4};
          y -= dy;
        }
        return y;
      }